

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall ON_wString::Example(ON_wString *this,ExampleType t)

{
  bool bVar1;
  ON_wString *local_348;
  ON_wString local_328;
  ON_wString local_320;
  ON_wString local_318;
  ON_wString local_310;
  ON_wString local_308;
  ON_wString local_300;
  ON_wString local_2f8;
  ON_wString local_2f0;
  ON_wString local_2e8;
  ON_wString local_2e0;
  ON_wString local_2d8;
  ON_wString local_2d0;
  ON_wString local_2c8;
  ON_wString local_2c0;
  ON_wString local_2b8;
  ON_wString local_2b0;
  ON_wString local_2a8;
  ON_wString local_2a0;
  ON_wString local_298;
  ON_wString local_290;
  ON_wString local_288;
  ON_wString local_280;
  ON_wString local_278;
  ON_wString local_270;
  ON_wString local_268;
  ON_wString local_260;
  ON_wString local_258;
  ON_wString local_250;
  ON_wString local_248;
  ON_wString local_240;
  ON_wString local_238;
  ON_wString local_230;
  ON_wString local_228;
  ON_wString local_220;
  ON_wString local_218;
  ON_wString local_210;
  ON_wString local_208;
  ON_wString local_200;
  ON_wString local_1f8;
  ON_wString local_1f0;
  ON_wString local_1e8;
  ON_wString local_1e0;
  ON_wString local_1d8;
  ON_wString local_1d0;
  ON_wString local_1c8;
  ON_wString local_1c0;
  ON_wString local_1b8;
  ON_wString local_1b0;
  ON_wString local_1a8;
  ON_wString local_1a0;
  ON_wString local_198;
  ON_wString local_190;
  ON_wString local_188;
  ON_wString local_180;
  ON_wString local_178;
  ON_wString local_170;
  ON_wString local_168;
  ON_wString local_160;
  ON_wString local_158;
  ON_wString local_150;
  ON_wString local_148;
  ON_wString local_140;
  ON_wString local_138;
  ON_wString local_130;
  ON_wString local_128;
  ON_wString local_120;
  ON_wString local_118;
  ON_wString local_110;
  ON_wString local_108;
  ON_wString local_100;
  ON_wString local_f8;
  ON_wString local_f0;
  ON_wString local_e8;
  ON_wString local_e0;
  ON_wString local_d8;
  ON_wString local_d0 [3];
  ON_wString local_b8;
  ON_wString local_b0;
  ON_wString local_a8;
  ON_wString local_a0;
  ON_wString local_98;
  ON_wString local_90;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString local_78;
  ON_wString local_70;
  ON_wString local_68;
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString local_40;
  ON_wString local_38;
  ON_wString local_30;
  ON_wString local_28;
  ON_wString local_20;
  ON_wString s;
  ExampleType t_local;
  
  s.m_s._4_4_ = t;
  ON_wString(&local_20);
  if (s.m_s._4_4_ != Empty) {
    if (s.m_s._4_4_ == WideChar) {
      ON_wString(&local_b8,L"The math teacher said, \"It isn\'t true that 2");
      operator+(&local_b0,(wchar_t)&local_b8);
      ON_wString(local_d0,L"=3");
      operator+(&local_a8,&local_b0);
      operator+(&local_a0,(wchar_t)&local_a8);
      ON_wString(&local_d8,L" & ");
      operator+(&local_98,&local_a0);
      operator+(&local_90,(wchar_t)&local_98);
      ON_wString(&local_e0,L" > 3");
      operator+(&local_88,&local_90);
      operator+(&local_80,(wchar_t)&local_88);
      ON_wString(&local_e8,L" & ");
      operator+(&local_78,&local_80);
      operator+(&local_70,(wchar_t)&local_78);
      ON_wString(&local_f0,L" < 2 ");
      operator+(&local_68,&local_70);
      operator+(&local_60,(wchar_t)&local_68);
      ON_wString(&local_f8,L" & ");
      operator+(&local_58,&local_60);
      operator+(&local_50,(wchar_t)&local_58);
      ON_wString(&local_100,L" > ");
      operator+(&local_48,&local_50);
      operator+(&local_40,(wchar_t)&local_48);
      ON_wString(&local_108,L"99.\" ");
      operator+(&local_38,&local_40);
      ON_wString(&local_110,L'🗑',1);
      operator+(&local_30,&local_38);
      ON_wString(&local_118,L"!");
      operator+(&local_28,&local_30);
      operator=(&local_20,&local_28);
      ~ON_wString(&local_28);
      ~ON_wString(&local_118);
      ~ON_wString(&local_30);
      ~ON_wString(&local_110);
      ~ON_wString(&local_38);
      ~ON_wString(&local_108);
      ~ON_wString(&local_40);
      ~ON_wString(&local_48);
      ~ON_wString(&local_100);
      ~ON_wString(&local_50);
      ~ON_wString(&local_58);
      ~ON_wString(&local_f8);
      ~ON_wString(&local_60);
      ~ON_wString(&local_68);
      ~ON_wString(&local_f0);
      ~ON_wString(&local_70);
      ~ON_wString(&local_78);
      ~ON_wString(&local_e8);
      ~ON_wString(&local_80);
      ~ON_wString(&local_88);
      ~ON_wString(&local_e0);
      ~ON_wString(&local_90);
      ~ON_wString(&local_98);
      ~ON_wString(&local_d8);
      ~ON_wString(&local_a0);
      ~ON_wString(&local_a8);
      ~ON_wString(local_d0);
      ~ON_wString(&local_b0);
      ~ON_wString(&local_b8);
    }
    else if (s.m_s._4_4_ == UTF16) {
      ON_wString(&local_1b8,L"The math teacher said, \"It isn\'t true that 2");
      operator+(&local_1b0,(wchar_t)&local_1b8);
      ON_wString(&local_1c0,L"=3");
      operator+(&local_1a8,&local_1b0);
      operator+(&local_1a0,(wchar_t)&local_1a8);
      ON_wString(&local_1c8,L" & ");
      operator+(&local_198,&local_1a0);
      operator+(&local_190,(wchar_t)&local_198);
      ON_wString(&local_1d0,L" > 3");
      operator+(&local_188,&local_190);
      operator+(&local_180,(wchar_t)&local_188);
      ON_wString(&local_1d8,L" & ");
      operator+(&local_178,&local_180);
      operator+(&local_170,(wchar_t)&local_178);
      ON_wString(&local_1e0,L" < 2 ");
      operator+(&local_168,&local_170);
      operator+(&local_160,(wchar_t)&local_168);
      ON_wString(&local_1e8,L" & ");
      operator+(&local_158,&local_160);
      operator+(&local_150,(wchar_t)&local_158);
      ON_wString(&local_1f0,L" > ");
      operator+(&local_148,&local_150);
      operator+(&local_140,(wchar_t)&local_148);
      ON_wString(&local_1f8,L"99.\" ");
      operator+(&local_138,&local_140);
      ON_wString(&local_200,L'\xd83d',1);
      operator+(&local_130,&local_138);
      ON_wString(&local_208,L'\xddd1',1);
      operator+(&local_128,&local_130);
      ON_wString(&local_210,L"!");
      operator+(&local_120,&local_128);
      operator=(&local_20,&local_120);
      ~ON_wString(&local_120);
      ~ON_wString(&local_210);
      ~ON_wString(&local_128);
      ~ON_wString(&local_208);
      ~ON_wString(&local_130);
      ~ON_wString(&local_200);
      ~ON_wString(&local_138);
      ~ON_wString(&local_1f8);
      ~ON_wString(&local_140);
      ~ON_wString(&local_148);
      ~ON_wString(&local_1f0);
      ~ON_wString(&local_150);
      ~ON_wString(&local_158);
      ~ON_wString(&local_1e8);
      ~ON_wString(&local_160);
      ~ON_wString(&local_168);
      ~ON_wString(&local_1e0);
      ~ON_wString(&local_170);
      ~ON_wString(&local_178);
      ~ON_wString(&local_1d8);
      ~ON_wString(&local_180);
      ~ON_wString(&local_188);
      ~ON_wString(&local_1d0);
      ~ON_wString(&local_190);
      ~ON_wString(&local_198);
      ~ON_wString(&local_1c8);
      ~ON_wString(&local_1a0);
      ~ON_wString(&local_1a8);
      ~ON_wString(&local_1c0);
      ~ON_wString(&local_1b0);
      ~ON_wString(&local_1b8);
    }
    else if (s.m_s._4_4_ == RichText) {
      RichTextExample(&local_218,&ON_Font::Default);
      operator=(&local_20,&local_218);
      ~ON_wString(&local_218);
    }
    else if (s.m_s._4_4_ == XML) {
      ON_wString(&local_2b8,L"The math teacher said, &quot;It isn&apos;t true that 2");
      operator+(&local_2b0,(wchar_t)&local_2b8);
      ON_wString(&local_2c0,L"=3");
      operator+(&local_2a8,&local_2b0);
      operator+(&local_2a0,(wchar_t)&local_2a8);
      ON_wString(&local_2c8,L" &amp; ");
      operator+(&local_298,&local_2a0);
      operator+(&local_290,(wchar_t)&local_298);
      ON_wString(&local_2d0,L" &gt; 3");
      operator+(&local_288,&local_290);
      operator+(&local_280,(wchar_t)&local_288);
      ON_wString(&local_2d8,L" &amp; ");
      operator+(&local_278,&local_280);
      operator+(&local_270,(wchar_t)&local_278);
      ON_wString(&local_2e0,L" &lt; 2 ");
      operator+(&local_268,&local_270);
      operator+(&local_260,(wchar_t)&local_268);
      ON_wString(&local_2e8,L" &amp; ");
      operator+(&local_258,&local_260);
      operator+(&local_250,(wchar_t)&local_258);
      ON_wString(&local_2f0,L" &gt; ");
      operator+(&local_248,&local_250);
      operator+(&local_240,(wchar_t)&local_248);
      ON_wString(&local_2f8,L"99.&quot; ");
      operator+(&local_238,&local_240);
      ON_wString(&local_300,L'\xd83d',1);
      operator+(&local_230,&local_238);
      ON_wString(&local_308,L'\xddd1',1);
      operator+(&local_228,&local_230);
      ON_wString(&local_310,L"!");
      operator+(&local_220,&local_228);
      operator=(&local_20,&local_220);
      ~ON_wString(&local_220);
      ~ON_wString(&local_310);
      ~ON_wString(&local_228);
      ~ON_wString(&local_308);
      ~ON_wString(&local_230);
      ~ON_wString(&local_300);
      ~ON_wString(&local_238);
      ~ON_wString(&local_2f8);
      ~ON_wString(&local_240);
      ~ON_wString(&local_248);
      ~ON_wString(&local_2f0);
      ~ON_wString(&local_250);
      ~ON_wString(&local_258);
      ~ON_wString(&local_2e8);
      ~ON_wString(&local_260);
      ~ON_wString(&local_268);
      ~ON_wString(&local_2e0);
      ~ON_wString(&local_270);
      ~ON_wString(&local_278);
      ~ON_wString(&local_2d8);
      ~ON_wString(&local_280);
      ~ON_wString(&local_288);
      ~ON_wString(&local_2d0);
      ~ON_wString(&local_290);
      ~ON_wString(&local_298);
      ~ON_wString(&local_2c8);
      ~ON_wString(&local_2a0);
      ~ON_wString(&local_2a8);
      ~ON_wString(&local_2c0);
      ~ON_wString(&local_2b0);
      ~ON_wString(&local_2b8);
    }
    else if (s.m_s._4_4_ == XMLalternate1) {
      ON_wString(&local_318,
                 L"The math teacher said, &quot;It isn&apos;t true that 2&#xb3;=3&#xb2; &amp; &#x3a3; &gt; 3&#xa2; &amp; &#x3a3; &lt; 2 &#x20bd; &amp; &#x3a3; &gt; &#x20ac;99.&quot; &#x1f5d1;!"
                );
      operator=(&local_20,&local_318);
      ~ON_wString(&local_318);
    }
    else if (s.m_s._4_4_ == XMLalternate2) {
      ON_wString(&local_320,
                 L"The math teacher said, &quot;It isn&apos;t true that 2&#xb3;=3&#xb2; &amp; &#x3A3; &gt; 3&#xA2; &amp; &#x3A3; &lt; 2 &#x20BD; &amp; &#x3A3; &gt; &#x20AC;99.&quot; &#x1F5D1;!"
                );
      operator=(&local_20,&local_320);
      ~ON_wString(&local_320);
    }
    else if (s.m_s._4_4_ == XMLalternate3) {
      ON_wString(&local_328,
                 L"The math teacher said, &#34;It isn&#39;t true that 2&#179;=3&#178; &amp; &#931; &#62; 3&#162; &#38; &#931; &#60; 2 &#8381; &#38; &#931; &#62; &#8364;99.&#34; &#128465;!"
                );
      operator=(&local_20,&local_328);
      ~ON_wString(&local_328);
    }
  }
  bVar1 = IsNotEmpty(&local_20);
  if (bVar1) {
    local_348 = &local_20;
  }
  else {
    local_348 = &EmptyString;
  }
  ON_wString(this,local_348);
  ~ON_wString(&local_20);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::Example(ON_wString::ExampleType t)
{
  ON_wString s;
  switch (t)
  {
  case ON_wString::ExampleType::Empty:
    break;

  case ON_wString::ExampleType::WideChar:
    s = ON_wString(
      ON_wString(L"The math teacher said, \"It isn't true that 2")
      + ON_wString::Superscript3 + ON_wString(L"=3") + ON_wString::Superscript2
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" > 3")
      + ON_wString::CentSign
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" < 2 ")
      + ON_wString::RubleSign
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" > ")
      + ON_wString::EuroSign
      + ON_wString(L"99.\" ")
#if defined(ON_SIZEOF_WCHAR_T) && ON_SIZEOF_WCHAR_T >= 4
      + ON_wString((wchar_t)0x1F5D1) // UTF-32 encoding for WASTEBASKET U+1F5D1
#else
      + ON_wString((wchar_t)0xD83D) // (0xD83D, 0xDDD1) is the UTF-16 surrogate pair encoding for WASTEBASKET U+1F5D1
      + ON_wString((wchar_t)0xDDD1)
#endif
      + ON_wString(L"!")
    );
    break;

  case ON_wString::ExampleType::UTF16:
    s = ON_wString(
      ON_wString(L"The math teacher said, \"It isn't true that 2")
      + ON_wString::Superscript3 + ON_wString(L"=3") + ON_wString::Superscript2
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" > 3")
      + ON_wString::CentSign
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" < 2 ")
      + ON_wString::RubleSign
      + ON_wString(L" & ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" > ")
      + ON_wString::EuroSign
      + ON_wString(L"99.\" ")
      + ON_wString((wchar_t)(wchar_t)0xD83D) // (0xD83D, 0xDDD1) is the UTF-16 surrogate pair encoding for WASTEBASKET U+1F5D1
      + ON_wString((wchar_t)(wchar_t)0xDDD1)
      + ON_wString(L"!")
    );
    break;

  case ON_wString::ExampleType::RichText:
    s = ON_wString::RichTextExample(&ON_Font::Default);
    break;

  case ON_wString::ExampleType::XML:
    /// The UTF string as an XML value with special characters encoded in the &amp;amp; format
    /// and code points above basic latin UTF encoded.
    s = ON_wString(
      ON_wString(L"The math teacher said, &quot;It isn&apos;t true that 2")
      + ON_wString::Superscript3 + ON_wString(L"=3") + ON_wString::Superscript2
      + ON_wString(L" &amp; ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" &gt; 3")
      + ON_wString::CentSign
      + ON_wString(L" &amp; ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" &lt; 2 ")
      + ON_wString::RubleSign
      + ON_wString(L" &amp; ")
      + ON_wString::GreekCapitalSigma
      + ON_wString(L" &gt; ")
      + ON_wString::EuroSign
      + ON_wString(L"99.&quot; ")
      + ON_wString((wchar_t)(wchar_t)0xD83D) // (0xD83D, 0xDDD1) is the UTF-16 surrogate pair encoding for WASTEBASKET U+1F5D1
      + ON_wString((wchar_t)(wchar_t)0xDDD1)
      + ON_wString(L"!")
      );
      break;

  case ON_wString::ExampleType::XMLalternate1:
    /// The UTF string as an XML value with special characters encoded in the &amp;amp; format
    /// and code points above basic latin encoded in the &#hhhh; format
    /// using  lower case hex digits (0123456789abcdef).
    s = ON_wString(L"The math teacher said, &quot;It isn&apos;t true that 2&#xb3;=3&#xb2; &amp; &#x3a3; &gt; 3&#xa2; &amp; &#x3a3; &lt; 2 &#x20bd; &amp; &#x3a3; &gt; &#x20ac;99.&quot; &#x1f5d1;!");
    break;

  case ON_wString::ExampleType::XMLalternate2:
    /// The UTF string as an XML value with special characters encoded in the &amp;amp; format
    /// and code points above basic latin encoded in the hexadecimal &amp;#xhhhh; format
    /// with  upper case hex digits (0123456789ABCDEF).
    s = ON_wString(L"The math teacher said, &quot;It isn&apos;t true that 2&#xb3;=3&#xb2; &amp; &#x3A3; &gt; 3&#xA2; &amp; &#x3A3; &lt; 2 &#x20BD; &amp; &#x3A3; &gt; &#x20AC;99.&quot; &#x1F5D1;!");
    break;

  case ON_wString::ExampleType::XMLalternate3:
    /// The UTF string as an XML value with special characters and code points above
    /// basic latin encoded in the decimal code point &amp;#nnnn; format.
    s = ON_wString(L"The math teacher said, &#34;It isn&#39;t true that 2&#179;=3&#178; &amp; &#931; &#62; 3&#162; &#38; &#931; &#60; 2 &#8381; &#38; &#931; &#62; &#8364;99.&#34; &#128465;!");
    break;

  default:
    break;
  }

  return s.IsNotEmpty() ? s : ON_wString::EmptyString;
}